

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O3

void __thiscall cfd::core::Psbt::SetGlobalRecord(Psbt *this,ByteData *key,ByteData *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  void *pvVar2;
  bool bVar3;
  CfdException *pCVar4;
  wally_map *map_in;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key_vec;
  vector<unsigned_char,_std::allocator<unsigned_char>_> val_vec;
  string local_78;
  int local_54;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  pvVar2 = this->wally_psbt_pointer_;
  bVar3 = ByteData::IsEmpty(key);
  if (bVar3) {
    local_78._M_dataplus._M_p = "cfdcore_psbt.cpp";
    local_78._M_string_length = CONCAT44(local_78._M_string_length._4_4_,0xcc3);
    local_78.field_2._M_allocated_capacity._0_7_ = 0x5d9004;
    local_78.field_2._M_local_buf[7] = '\0';
    logger::log<>((CfdSourceLocation *)&local_78,kCfdLogLevelWarning,"psbt empty key error.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"psbt empty key error.","");
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_78);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::GetBytes(&local_50,key);
  ByteData::GetBytes(&local_38,value);
  if (pvVar2 == (void *)0x0) {
    local_78._M_dataplus._M_p = "cfdcore_psbt.cpp";
    local_78._M_string_length = CONCAT44(local_78._M_string_length._4_4_,0x375);
    local_78.field_2._M_allocated_capacity._0_7_ = 0x5d94d6;
    local_78.field_2._M_local_buf[7] = '\0';
    logger::log<>((CfdSourceLocation *)&local_78,kCfdLogLevelWarning,"psbt pointer is null");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"psbt pointer is null.","");
    CfdException::CfdException(pCVar4,kCfdIllegalStateError,&local_78);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (*(char *)(wally_map_item **)
               local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start == -5) {
    if ((long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start == 1) {
      local_78._M_dataplus._M_p = "cfdcore_psbt.cpp";
      local_78._M_string_length = CONCAT44(local_78._M_string_length._4_4_,0x38a);
      local_78.field_2._M_allocated_capacity._0_7_ = 0x5d94d6;
      local_78.field_2._M_local_buf[7] = '\0';
      logger::log<>((CfdSourceLocation *)&local_78,kCfdLogLevelWarning,
                    "setting global version is not supported.");
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"psbt setting global version is not supported error.","");
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_78);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_78._M_dataplus._M_p = "cfdcore_psbt.cpp";
    local_78._M_string_length = CONCAT44(local_78._M_string_length._4_4_,0x386);
    local_78.field_2._M_allocated_capacity._0_7_ = 0x5d94d6;
    local_78.field_2._M_local_buf[7] = '\0';
    logger::log<>((CfdSourceLocation *)&local_78,kCfdLogLevelWarning,"psbt invalid key format.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"psbt invalid key format error.","");
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_78);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (*(char *)(wally_map_item **)
               local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start != '\0') {
    map_in = (wally_map *)((long)pvVar2 + 0x40);
    paVar1 = &local_78.field_2;
    local_78.field_2._M_allocated_capacity._0_7_ = 0x206c61626f6c67;
    local_78.field_2._M_local_buf[7] = 'u';
    local_78.field_2._8_7_ = 0x736e776f6e6b6e;
    local_78._M_string_length = 0xf;
    local_78.field_2._M_local_buf[0xf] = '\0';
    local_78._M_dataplus._M_p = (pointer)paVar1;
    FindPsbtMap((core *)map_in,
                (wally_map *)
                local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start,
                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish,&local_78,(size_t *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    local_54 = wally_map_add(map_in,local_50.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                             (long)local_50.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_50.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                             local_38.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                             (long)local_38.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_38.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
    if (local_54 == 0) {
      local_54 = wally_map_sort(map_in,0);
      if (local_54 == 0) {
        if (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (uchar *)0x0) {
          operator_delete(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((wally_map *)
            local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (wally_map *)0x0) {
          operator_delete(local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        return;
      }
      local_78._M_dataplus._M_p = "cfdcore_psbt.cpp";
      local_78._M_string_length = CONCAT44(local_78._M_string_length._4_4_,0xccd);
      local_78.field_2._M_allocated_capacity._0_7_ = 0x5d9004;
      local_78.field_2._M_local_buf[7] = '\0';
      logger::log<int&>((CfdSourceLocation *)&local_78,kCfdLogLevelWarning,"wally_map_sort NG[{}]",
                        &local_54);
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      local_78._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"psbt sort unknowns error.","");
      CfdException::CfdException(pCVar4,kCfdInternalError,&local_78);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_78._M_dataplus._M_p = "cfdcore_psbt.cpp";
    local_78._M_string_length = CONCAT44(local_78._M_string_length._4_4_,0x393);
    local_78.field_2._M_allocated_capacity._0_7_ = 0x5d94d6;
    local_78.field_2._M_local_buf[7] = '\0';
    logger::log<int&>((CfdSourceLocation *)&local_78,kCfdLogLevelWarning,"wally_map_add NG[{}]",
                      &local_54);
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_78._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"psbt add global unknowns error.","");
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_78);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if ((long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == 1) {
    local_78._M_dataplus._M_p = "cfdcore_psbt.cpp";
    local_78._M_string_length = CONCAT44(local_78._M_string_length._4_4_,0x380);
    local_78.field_2._M_allocated_capacity._0_7_ = 0x5d94d6;
    local_78.field_2._M_local_buf[7] = '\0';
    logger::log<>((CfdSourceLocation *)&local_78,kCfdLogLevelWarning,
                  "setting global tx is not supported.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"psbt setting global tx is not supported error.","");
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_78);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_78._M_dataplus._M_p = "cfdcore_psbt.cpp";
  local_78._M_string_length = CONCAT44(local_78._M_string_length._4_4_,0x37c);
  local_78.field_2._M_allocated_capacity._0_7_ = 0x5d94d6;
  local_78.field_2._M_local_buf[7] = '\0';
  logger::log<>((CfdSourceLocation *)&local_78,kCfdLogLevelWarning,"psbt invalid key format.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"psbt invalid key format error.","");
  CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_78);
  __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void Psbt::SetGlobalRecord(const ByteData &key, const ByteData &value) {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  if (key.IsEmpty()) {
    warn(CFD_LOG_SOURCE, "psbt empty key error.");
    throw CfdException(kCfdIllegalArgumentError, "psbt empty key error.");
  }
  auto key_vec = key.GetBytes();
  auto val_vec = value.GetBytes();

  SetPsbtGlobal(key_vec, val_vec, psbt_pointer);

  int ret = wally_map_sort(&psbt_pointer->unknowns, 0);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_map_sort NG[{}]", ret);
    throw CfdException(kCfdInternalError, "psbt sort unknowns error.");
  }
}